

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imtui-demo.cpp
# Opt level: O3

void ImTui::ShowAboutWindow(bool *p_open)

{
  ImFontAtlas *pIVar1;
  bool bVar2;
  ImGuiID id;
  uint uVar3;
  char *pcVar4;
  ImGuiIO *pIVar5;
  ImGuiStyle *pIVar6;
  float fVar7;
  ImVec2 local_30;
  
  bVar2 = ImGui::Begin("About Dear ImGui",p_open,0x40);
  if (bVar2) {
    pcVar4 = ImGui::GetVersion();
    ImGui::Text("Dear ImGui %s",pcVar4);
    ImGui::Separator();
    ImGui::Text("By Omar Cornut and all Dear ImGui contributors.");
    ImGui::Text("Dear ImGui is licensed under the MIT License, see LICENSE for more information.");
    ImGui::Checkbox("Config/Build Information",&ShowAboutWindow::show_config_info);
    if (ShowAboutWindow::show_config_info == true) {
      pIVar5 = ImGui::GetIO();
      pIVar6 = ImGui::GetStyle();
      local_30.x = 0.0;
      local_30.y = 0.0;
      bVar2 = ImGui::Button("Copy to clipboard",&local_30);
      id = ImGui::GetID("cfginfos");
      fVar7 = ImGui::GetTextLineHeightWithSpacing();
      local_30 = (ImVec2)((ulong)(uint)(fVar7 * 18.0) << 0x20);
      ImGui::BeginChildFrame(id,&local_30,4);
      if (bVar2) {
        ImGui::LogToClipboard(-1);
        ImGui::LogText("```\n");
      }
      ImGui::Text("Dear ImGui %s (%d)","1.81",0x46b4);
      ImGui::Separator();
      ImGui::Text("sizeof(size_t): %d, sizeof(ImDrawIdx): %d, sizeof(ImDrawVert): %d",8,2,0x14);
      ImGui::Text("define: __cplusplus=%d",0x3118f);
      ImGui::Text("define: __linux__");
      ImGui::Text("define: __GNUC__=%d",4);
      ImGui::Text("define: __clang_version__=%s",
                  "19.1.5 (https://github.com/swiftlang/llvm-project.git 188208b14562121ae1ac90190d00d823bcfbccff)"
                 );
      ImGui::Separator();
      pcVar4 = pIVar5->BackendPlatformName;
      if (pcVar4 == (char *)0x0) {
        pcVar4 = "NULL";
      }
      ImGui::Text("io.BackendPlatformName: %s",pcVar4);
      pcVar4 = pIVar5->BackendRendererName;
      if (pcVar4 == (char *)0x0) {
        pcVar4 = "NULL";
      }
      ImGui::Text("io.BackendRendererName: %s",pcVar4);
      ImGui::Text("io.ConfigFlags: 0x%08X",(ulong)(uint)pIVar5->ConfigFlags);
      uVar3 = pIVar5->ConfigFlags;
      if ((uVar3 & 1) != 0) {
        ImGui::Text(" NavEnableKeyboard");
        uVar3 = pIVar5->ConfigFlags;
      }
      if ((uVar3 & 2) != 0) {
        ImGui::Text(" NavEnableGamepad");
        uVar3 = pIVar5->ConfigFlags;
      }
      if ((uVar3 & 4) != 0) {
        ImGui::Text(" NavEnableSetMousePos");
        uVar3 = pIVar5->ConfigFlags;
      }
      if ((uVar3 & 8) != 0) {
        ImGui::Text(" NavNoCaptureKeyboard");
        uVar3 = pIVar5->ConfigFlags;
      }
      if ((uVar3 & 0x10) != 0) {
        ImGui::Text(" NoMouse");
        uVar3 = pIVar5->ConfigFlags;
      }
      if ((uVar3 & 0x20) != 0) {
        ImGui::Text(" NoMouseCursorChange");
      }
      if (pIVar5->MouseDrawCursor == true) {
        ImGui::Text("io.MouseDrawCursor");
      }
      if (pIVar5->ConfigMacOSXBehaviors == true) {
        ImGui::Text("io.ConfigMacOSXBehaviors");
      }
      if (pIVar5->ConfigInputTextCursorBlink == true) {
        ImGui::Text("io.ConfigInputTextCursorBlink");
      }
      if (pIVar5->ConfigWindowsResizeFromEdges == true) {
        ImGui::Text("io.ConfigWindowsResizeFromEdges");
      }
      if (pIVar5->ConfigWindowsMoveFromTitleBarOnly == true) {
        ImGui::Text("io.ConfigWindowsMoveFromTitleBarOnly");
      }
      if (0.0 <= pIVar5->ConfigMemoryCompactTimer) {
        ImGui::Text("io.ConfigWindowsMemoryCompactTimer = %.1ff",
                    (double)pIVar5->ConfigMemoryCompactTimer);
      }
      ImGui::Text("io.BackendFlags: 0x%08X",(ulong)(uint)pIVar5->BackendFlags);
      uVar3 = pIVar5->BackendFlags;
      if ((uVar3 & 1) != 0) {
        ImGui::Text(" HasGamepad");
        uVar3 = pIVar5->BackendFlags;
      }
      if ((uVar3 & 2) != 0) {
        ImGui::Text(" HasMouseCursors");
        uVar3 = pIVar5->BackendFlags;
      }
      if ((uVar3 & 4) != 0) {
        ImGui::Text(" HasSetMousePos");
        uVar3 = pIVar5->BackendFlags;
      }
      if ((uVar3 & 8) != 0) {
        ImGui::Text(" RendererHasVtxOffset");
      }
      ImGui::Separator();
      pIVar1 = pIVar5->Fonts;
      ImGui::Text("io.Fonts: %d fonts, Flags: 0x%08X, TexSize: %d,%d",
                  (ulong)(uint)(pIVar1->Fonts).Size,(ulong)(uint)pIVar1->Flags,
                  (ulong)(uint)pIVar1->TexWidth,(ulong)(uint)pIVar1->TexHeight);
      ImGui::Text("io.DisplaySize: %.2f,%.2f",(double)(pIVar5->DisplaySize).x,
                  (double)(pIVar5->DisplaySize).y);
      ImGui::Text("io.DisplayFramebufferScale: %.2f,%.2f",
                  (double)(pIVar5->DisplayFramebufferScale).x,
                  (double)(pIVar5->DisplayFramebufferScale).y);
      ImGui::Separator();
      ImGui::Text("style.WindowPadding: %.2f,%.2f",(double)(pIVar6->WindowPadding).x,
                  (double)(pIVar6->WindowPadding).y);
      ImGui::Text("style.WindowBorderSize: %.2f",(double)pIVar6->WindowBorderSize);
      ImGui::Text("style.FramePadding: %.2f,%.2f",(double)(pIVar6->FramePadding).x,
                  (double)(pIVar6->FramePadding).y);
      ImGui::Text("style.FrameRounding: %.2f",(double)pIVar6->FrameRounding);
      ImGui::Text("style.FrameBorderSize: %.2f",(double)pIVar6->FrameBorderSize);
      ImGui::Text("style.ItemSpacing: %.2f,%.2f",(double)(pIVar6->ItemSpacing).x,
                  (double)(pIVar6->ItemSpacing).y);
      ImGui::Text("style.ItemInnerSpacing: %.2f,%.2f",(double)(pIVar6->ItemInnerSpacing).x,
                  (double)(pIVar6->ItemInnerSpacing).y);
      if (bVar2) {
        ImGui::LogText("\n```\n");
        ImGui::LogFinish();
      }
      ImGui::EndChildFrame();
    }
    ImGui::End();
    return;
  }
  ImGui::End();
  return;
}

Assistant:

void ImTui::ShowAboutWindow(bool* p_open)
{
    if (!ImGui::Begin("About Dear ImGui", p_open, ImGuiWindowFlags_AlwaysAutoResize))
    {
        ImGui::End();
        return;
    }
    ImGui::Text("Dear ImGui %s", ImGui::GetVersion());
    ImGui::Separator();
    ImGui::Text("By Omar Cornut and all Dear ImGui contributors.");
    ImGui::Text("Dear ImGui is licensed under the MIT License, see LICENSE for more information.");

    static bool show_config_info = false;
    ImGui::Checkbox("Config/Build Information", &show_config_info);
    if (show_config_info)
    {
        ImGuiIO& io = ImGui::GetIO();
        ImGuiStyle& style = ImGui::GetStyle();

        bool copy_to_clipboard = ImGui::Button("Copy to clipboard");
        ImGui::BeginChildFrame(ImGui::GetID("cfginfos"), ImVec2(0, ImGui::GetTextLineHeightWithSpacing() * 18), ImGuiWindowFlags_NoMove);
        if (copy_to_clipboard)
        {
            ImGui::LogToClipboard();
            ImGui::LogText("```\n"); // Back quotes will make the text appears without formatting when pasting to GitHub
        }

        ImGui::Text("Dear ImGui %s (%d)", IMGUI_VERSION, IMGUI_VERSION_NUM);
        ImGui::Separator();
        ImGui::Text("sizeof(size_t): %d, sizeof(ImDrawIdx): %d, sizeof(ImDrawVert): %d", (int)sizeof(size_t), (int)sizeof(ImDrawIdx), (int)sizeof(ImDrawVert));
        ImGui::Text("define: __cplusplus=%d", (int)__cplusplus);
#ifdef IMGUI_DISABLE_OBSOLETE_FUNCTIONS
        ImGui::Text("define: IMGUI_DISABLE_OBSOLETE_FUNCTIONS");
#endif
#ifdef IMGUI_DISABLE_WIN32_DEFAULT_CLIPBOARD_FUNCTIONS
        ImGui::Text("define: IMGUI_DISABLE_WIN32_DEFAULT_CLIPBOARD_FUNCTIONS");
#endif
#ifdef IMGUI_DISABLE_WIN32_DEFAULT_IME_FUNCTIONS
        ImGui::Text("define: IMGUI_DISABLE_WIN32_DEFAULT_IME_FUNCTIONS");
#endif
#ifdef IMGUI_DISABLE_WIN32_FUNCTIONS
        ImGui::Text("define: IMGUI_DISABLE_WIN32_FUNCTIONS");
#endif
#ifdef IMGUI_DISABLE_DEFAULT_FORMAT_FUNCTIONS
        ImGui::Text("define: IMGUI_DISABLE_DEFAULT_FORMAT_FUNCTIONS");
#endif
#ifdef IMGUI_DISABLE_DEFAULT_MATH_FUNCTIONS
        ImGui::Text("define: IMGUI_DISABLE_DEFAULT_MATH_FUNCTIONS");
#endif
#ifdef IMGUI_DISABLE_DEFAULT_FILE_FUNCTIONS
        ImGui::Text("define: IMGUI_DISABLE_DEFAULT_FILE_FUNCTIONS");
#endif
#ifdef IMGUI_DISABLE_FILE_FUNCTIONS
        ImGui::Text("define: IMGUI_DISABLE_FILE_FUNCTIONS");
#endif
#ifdef IMGUI_DISABLE_DEFAULT_ALLOCATORS
        ImGui::Text("define: IMGUI_DISABLE_DEFAULT_ALLOCATORS");
#endif
#ifdef IMGUI_USE_BGRA_PACKED_COLOR
        ImGui::Text("define: IMGUI_USE_BGRA_PACKED_COLOR");
#endif
#ifdef _WIN32
        ImGui::Text("define: _WIN32");
#endif
#ifdef _WIN64
        ImGui::Text("define: _WIN64");
#endif
#ifdef __linux__
        ImGui::Text("define: __linux__");
#endif
#ifdef __APPLE__
        ImGui::Text("define: __APPLE__");
#endif
#ifdef _MSC_VER
        ImGui::Text("define: _MSC_VER=%d", _MSC_VER);
#endif
#ifdef __MINGW32__
        ImGui::Text("define: __MINGW32__");
#endif
#ifdef __MINGW64__
        ImGui::Text("define: __MINGW64__");
#endif
#ifdef __GNUC__
        ImGui::Text("define: __GNUC__=%d", (int)__GNUC__);
#endif
#ifdef __clang_version__
        ImGui::Text("define: __clang_version__=%s", __clang_version__);
#endif
        ImGui::Separator();
        ImGui::Text("io.BackendPlatformName: %s", io.BackendPlatformName ? io.BackendPlatformName : "NULL");
        ImGui::Text("io.BackendRendererName: %s", io.BackendRendererName ? io.BackendRendererName : "NULL");
        ImGui::Text("io.ConfigFlags: 0x%08X", io.ConfigFlags);
        if (io.ConfigFlags & ImGuiConfigFlags_NavEnableKeyboard)        ImGui::Text(" NavEnableKeyboard");
        if (io.ConfigFlags & ImGuiConfigFlags_NavEnableGamepad)         ImGui::Text(" NavEnableGamepad");
        if (io.ConfigFlags & ImGuiConfigFlags_NavEnableSetMousePos)     ImGui::Text(" NavEnableSetMousePos");
        if (io.ConfigFlags & ImGuiConfigFlags_NavNoCaptureKeyboard)     ImGui::Text(" NavNoCaptureKeyboard");
        if (io.ConfigFlags & ImGuiConfigFlags_NoMouse)                  ImGui::Text(" NoMouse");
        if (io.ConfigFlags & ImGuiConfigFlags_NoMouseCursorChange)      ImGui::Text(" NoMouseCursorChange");
        if (io.MouseDrawCursor)                                         ImGui::Text("io.MouseDrawCursor");
        if (io.ConfigMacOSXBehaviors)                                   ImGui::Text("io.ConfigMacOSXBehaviors");
        if (io.ConfigInputTextCursorBlink)                              ImGui::Text("io.ConfigInputTextCursorBlink");
        if (io.ConfigWindowsResizeFromEdges)                            ImGui::Text("io.ConfigWindowsResizeFromEdges");
        if (io.ConfigWindowsMoveFromTitleBarOnly)                       ImGui::Text("io.ConfigWindowsMoveFromTitleBarOnly");
        if (io.ConfigMemoryCompactTimer >= 0.0f)                        ImGui::Text("io.ConfigWindowsMemoryCompactTimer = %.1ff", io.ConfigMemoryCompactTimer);
        ImGui::Text("io.BackendFlags: 0x%08X", io.BackendFlags);
        if (io.BackendFlags & ImGuiBackendFlags_HasGamepad)             ImGui::Text(" HasGamepad");
        if (io.BackendFlags & ImGuiBackendFlags_HasMouseCursors)        ImGui::Text(" HasMouseCursors");
        if (io.BackendFlags & ImGuiBackendFlags_HasSetMousePos)         ImGui::Text(" HasSetMousePos");
        if (io.BackendFlags & ImGuiBackendFlags_RendererHasVtxOffset)   ImGui::Text(" RendererHasVtxOffset");
        ImGui::Separator();
        ImGui::Text("io.Fonts: %d fonts, Flags: 0x%08X, TexSize: %d,%d", io.Fonts->Fonts.Size, io.Fonts->Flags, io.Fonts->TexWidth, io.Fonts->TexHeight);
        ImGui::Text("io.DisplaySize: %.2f,%.2f", io.DisplaySize.x, io.DisplaySize.y);
        ImGui::Text("io.DisplayFramebufferScale: %.2f,%.2f", io.DisplayFramebufferScale.x, io.DisplayFramebufferScale.y);
        ImGui::Separator();
        ImGui::Text("style.WindowPadding: %.2f,%.2f", style.WindowPadding.x, style.WindowPadding.y);
        ImGui::Text("style.WindowBorderSize: %.2f", style.WindowBorderSize);
        ImGui::Text("style.FramePadding: %.2f,%.2f", style.FramePadding.x, style.FramePadding.y);
        ImGui::Text("style.FrameRounding: %.2f", style.FrameRounding);
        ImGui::Text("style.FrameBorderSize: %.2f", style.FrameBorderSize);
        ImGui::Text("style.ItemSpacing: %.2f,%.2f", style.ItemSpacing.x, style.ItemSpacing.y);
        ImGui::Text("style.ItemInnerSpacing: %.2f,%.2f", style.ItemInnerSpacing.x, style.ItemInnerSpacing.y);

        if (copy_to_clipboard)
        {
            ImGui::LogText("\n```\n");
            ImGui::LogFinish();
        }
        ImGui::EndChildFrame();
    }
    ImGui::End();
}